

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcShapeModel::IfcShapeModel(IfcShapeModel *this,void **vtt)

{
  void *pvVar1;
  _func_int **pp_Var2;
  
  IfcRepresentation::IfcRepresentation(&this->super_IfcRepresentation,vtt + 1);
  pvVar1 = vtt[5];
  *(void **)&(this->super_IfcRepresentation).field_0x80 = pvVar1;
  *(void **)(&(this->super_IfcRepresentation).field_0x80 + *(long *)((long)pvVar1 + -0x18)) = vtt[6]
  ;
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper = pp_Var2;
  *(void **)((long)&(this->super_IfcRepresentation).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]) = vtt[7];
  *(void **)&(this->super_IfcRepresentation).field_0x80 = vtt[8];
  return;
}

Assistant:

IfcShapeModel() : Object("IfcShapeModel") {}